

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task28.cpp
# Opt level: O0

int * random_num(int *a,int *b,int *c,int index)

{
  code *pcVar1;
  int index_local;
  int *c_local;
  int *b_local;
  int *a_local;
  
  a_local = a;
  if (((index != 0) && (a_local = b, index != 1)) && (a_local = c, index != 2)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  return a_local;
}

Assistant:

int* random_num (int* a, int* b, int* c, int index){
    switch (index) {
        case 0:
            return a;
        case 1:
            return b;
        case 2:
            return c;
    }
}